

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O1

int32 make_ci_list_cd_hash_frm_phnlist
                (char *phnlist,char ***CIlist,int32 *cilistsize,hashelement_t ***CDhash,
                int32 *NCDphones)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  phnhashelement_t **hashtable;
  lineiter_t *li;
  size_t sVar6;
  hashelement_t *phVar7;
  heapelement_t *phVar8;
  char *pcVar9;
  char **ppcVar10;
  char *fmt;
  size_t d1;
  int iVar11;
  size_t sVar12;
  long lVar13;
  phnhashelement_t *ppVar14;
  int32 heapsize;
  heapelement_t **heap;
  char rctx [1024];
  char lctx [1024];
  char wdpos [1024];
  char bphn [1024];
  int32 local_108c;
  uint local_1088;
  uint local_1084;
  uint local_1080;
  uint local_107c;
  phnhashelement_t **local_1078;
  char *local_1070;
  hashelement_t **local_1068;
  heapelement_t **local_1060;
  hashelement_t ***local_1058;
  int32 *local_1050;
  char ***local_1048;
  int *local_1040;
  int local_1038 [256];
  int local_c38 [256];
  short local_838 [512];
  short local_438 [516];
  
  local_1060 = (heapelement_t **)0x0;
  local_1040 = NCDphones;
  __stream = fopen(phnlist,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x74,"Unable to open %s for reading\n",phnlist);
LAB_0010382e:
    exit(1);
  }
  local_1058 = CDhash;
  local_1050 = cilistsize;
  local_1048 = CIlist;
  hashtable = (phnhashelement_t **)calloc(0x65,8);
  local_1068 = (hashelement_t **)
               __ckd_calloc__(0x5dc1,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                              ,0x78);
  local_1078 = hashtable;
  phninstall("SIL",hashtable);
  li = lineiter_start_clean((FILE *)__stream);
  if (li == (lineiter_t *)0x0) {
    sVar12 = 1;
    local_1088 = 0;
    local_1080 = 0;
    local_107c = 0;
    local_1084 = 0;
  }
  else {
    local_1084 = 0;
    iVar11 = 0;
    local_107c = 0;
    local_1080 = 0;
    local_1088 = 0;
    local_1070 = phnlist;
    do {
      iVar5 = __isoc99_sscanf(li->buf,"%s %s %s %s",local_438,local_c38,local_1038,local_838);
      if ((1 < iVar5 - 3U) && (iVar5 != 1)) {
        pcVar9 = li->buf;
        fmt = "Incorrect format in triphone file %s\n%s\n";
        lVar13 = 0x83;
LAB_0010381d:
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,lVar13,fmt,local_1070,pcVar9);
        goto LAB_0010382e;
      }
      if (local_438[0] == 0x2d) {
        pcVar9 = li->buf;
        fmt = "Bad entry triphone file %s\n%s\n";
        lVar13 = 0x85;
        goto LAB_0010381d;
      }
      if ((iVar5 == 1) || (((short)local_c38[0] == 0x2d && ((short)local_1038[0] == 0x2d)))) {
        sVar6 = strlen((char *)local_438);
        iVar5 = (int)sVar6;
        if ((int)sVar6 < iVar11) {
          iVar5 = iVar11;
        }
        iVar11 = iVar5;
        phninstall((char *)local_438,local_1078);
      }
      else {
        if (iVar5 == 3) {
          local_838[0] = 0x69;
        }
        if (((((char)local_c38[0] == '+') || (local_c38[0] == 0x4c4953)) ||
            ((char)local_1038[0] == '+')) || (local_1038[0] == 0x4c4953)) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x93,"Fillers in triphone, skipping:\n%s\n",li->buf);
        }
        else {
          phVar7 = install((char *)local_438,(char *)local_c38,(char *)local_1038,(char *)local_838,
                           local_1068);
          if (phVar7->dictcount == 0) {
            if (local_838[0] == 0x62) {
              local_1088 = local_1088 + 1;
            }
            else if (local_838[0] == 0x65) {
              local_1080 = local_1080 + 1;
            }
            else if (local_838[0] == 0x73) {
              local_1084 = local_1084 + 1;
            }
            else {
              local_107c = local_107c + (local_838[0] == 0x69);
            }
            phVar7->dictcount = 1;
          }
        }
      }
      li = lineiter_next(li);
    } while (li != (lineiter_t *)0x0);
    sVar12 = (size_t)(iVar11 + 1);
  }
  fclose(__stream);
  local_108c = 0;
  lVar13 = 0;
  do {
    for (ppVar14 = local_1078[lVar13]; ppVar14 != (phnhashelement_t *)0x0; ppVar14 = ppVar14->next)
    {
      phVar8 = (heapelement_t *)
               __ckd_calloc__(1,0x28,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                              ,0xad);
      pcVar9 = strdup(ppVar14->phone);
      phVar8->basephone = pcVar9;
      local_108c = insert(&local_1060,local_108c,phVar8);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x65);
  freephnhash(local_1078);
  d1 = (size_t)local_108c;
  *local_1050 = local_108c;
  ppcVar10 = (char **)__ckd_calloc_2d__(d1,sVar12,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                        ,0xb5);
  *local_1048 = ppcVar10;
  if (0 < (long)d1) {
    sVar12 = 0;
    do {
      phVar8 = yanktop(&local_1060,local_108c,&local_108c);
      strcpy(ppcVar10[sVar12],phVar8->basephone);
      free_heapelement(phVar8);
      sVar12 = sVar12 + 1;
    } while (d1 != sVar12);
  }
  uVar2 = local_1084;
  if (local_108c == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0xbd,"%d single word triphones in input phone list\n",(ulong)local_1084);
    uVar1 = local_1088;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0xbe,"%d word beginning triphones in input phone list\n",(ulong)local_1088);
    uVar4 = local_107c;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0xbf,"%d word internal triphones in input phone list\n",(ulong)local_107c);
    uVar3 = local_1080;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0xc0,"%d word ending triphones in input phone list\n",(ulong)local_1080);
    *local_1058 = local_1068;
    *local_1040 = uVar4 + uVar2 + uVar3 + uVar1;
    return 0;
  }
  __assert_fail("heapsize == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,0xbb,
                "int32 make_ci_list_cd_hash_frm_phnlist(const char *, char ***, int32 *, hashelement_t ***, int32 *)"
               );
}

Assistant:

int32 make_ci_list_cd_hash_frm_phnlist(const char  *phnlist,
		           	    char  ***CIlist, 
                           	    int32 *cilistsize,
			   	    hashelement_t ***CDhash,
				    int32 *NCDphones)
{
    char  bphn[1024],lctx[1024], rctx[1024], wdpos[1024]; 
    char  **cilist, *silence="SIL";
    lineiter_t *line = NULL;
    heapelement_t **heap=NULL, *addciphone;
    hashelement_t **tphnhash, *tphnptr;
    phnhashelement_t  **phnhash, *phnptr;

    int32 swdtphs, bwdtphs, ewdtphs, iwdtphs, maxphnsize, phnsize;
    int32 heapsize, i, nciphns, nwds;
    FILE  *fp;

    fp = fopen(phnlist,"r");
    if (fp==NULL) E_FATAL("Unable to open %s for reading\n",phnlist);

   /* Initially hash everything to remove duplications */
    phnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t*));
    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t*));
    maxphnsize = 0;
    swdtphs = bwdtphs = ewdtphs = iwdtphs = 0;
    /* Always install SIL in phonelist */
    phninstall(silence,phnhash);

    for (line = lineiter_start_clean(fp); line; line = lineiter_next(line)) {

        nwds = sscanf(line->buf,"%s %s %s %s",bphn,lctx,rctx,wdpos);

        if (nwds != 1 && nwds != 3 &&  nwds != 4)
	    E_FATAL("Incorrect format in triphone file %s\n%s\n",phnlist,line->buf);
        if (strcmp(bphn,"-") == 0)
	    E_FATAL("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
	    
        if (nwds == 1 || (!strcmp(lctx,"-") && !strcmp(rctx,"-"))) {
	    phnsize = strlen(bphn);
 	    if (phnsize > maxphnsize) maxphnsize = phnsize;
	    phninstall(bphn,phnhash);
        }
        else {
            if (nwds == 3) strcpy(wdpos,"i"); /* default */
            if (!strcmp(lctx,"-") && !strcmp(rctx,"-") && !strcmp(wdpos,"-")){
	        E_WARN("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
		continue;
	    }
	    if (IS_FILLER(lctx) || IS_FILLER(rctx)){
		E_WARN("Fillers in triphone, skipping:\n%s\n",line->buf);
		continue;
	    }
            if (!strcmp(wdpos,"i") && !strcmp(wdpos,"b") && 
		!strcmp(wdpos,"e") && !strcmp(wdpos,"s")){
		E_WARN("Bad word position type %s in triphone list\n",wdpos);
		E_WARN("Mapping it to word internal triphone\n");
		strcpy(wdpos,"i");
	    }
            tphnptr = install(bphn,lctx,rctx,wdpos,tphnhash);
	    if (tphnptr->dictcount == 0){
	        if (strcmp(wdpos,"s")==0) swdtphs++;
	        else if (strcmp(wdpos,"b")==0) bwdtphs++;
	        else if (strcmp(wdpos,"e")==0) ewdtphs++;
	        else if (strcmp(wdpos,"i")==0) iwdtphs++;
	        tphnptr->dictcount++;
	    }
	}
    }
    fclose(fp);

    /* Heap sort CI phones */
    heapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++) {
        phnptr = phnhash[i];
        while (phnptr != NULL) {
            addciphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
            addciphone->basephone = strdup(phnptr->phone);
            heapsize = insert(&heap, heapsize, addciphone);
            phnptr = phnptr->next;
        }
    }
    freephnhash(phnhash);
    *cilistsize = nciphns = heapsize;
    *CIlist = cilist = (char**)ckd_calloc_2d(nciphns,maxphnsize+1,sizeof(char));
    for (i = 0; i < nciphns; i++){
	addciphone = yanktop(&heap,heapsize,&heapsize);
        strcpy(cilist[i],addciphone->basephone);
        free_heapelement(addciphone);
    }
    assert(heapsize == 0);

    E_INFO("%d single word triphones in input phone list\n",swdtphs);
    E_INFO("%d word beginning triphones in input phone list\n",bwdtphs);
    E_INFO("%d word internal triphones in input phone list\n",iwdtphs);
    E_INFO("%d word ending triphones in input phone list\n",ewdtphs);

    *CDhash = tphnhash;
    *NCDphones = swdtphs + bwdtphs + iwdtphs + ewdtphs;

    return S3_SUCCESS;
}